

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-glyph.c
# Opt level: O2

_Bool borg_flow_glyph(int why)

{
  uint8_t uVar1;
  byte bVar2;
  borg_grid *pbVar3;
  loc_conflict grid1;
  uint8_t uVar4;
  int16_t iVar5;
  _Bool _Var6;
  ushort uVar7;
  wchar_t wVar8;
  uint uVar9;
  loc_conflict grid2;
  char *what;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ushort uVar15;
  wchar_t wVar16;
  ulong uVar17;
  ulong uVar18;
  wchar_t y;
  int local_114;
  borg_grid *ag_ptr [24];
  
  y = borg.c.y;
  uVar13 = (ulong)(uint)borg.c.x;
  if (glyph_y_center != '\0' || glyph_x_center != '\0') {
    grid2 = loc((uint)glyph_x_center,(uint)glyph_y_center);
    grid1.y = borg.c.y;
    grid1.x = borg.c.x;
    wVar8 = distance(grid1,grid2);
    if (wVar8 < L'2') goto LAB_002061ff;
  }
  borg_needs_new_sea = true;
LAB_002061ff:
  uVar4 = glyph_y;
  uVar1 = glyph_x;
  if ((borg.c.x == (uint)glyph_x) && (borg.c.y == (uint)glyph_y)) {
    glyph_x = '\0';
    glyph_y = '\0';
    if (borg_needs_new_sea == true) {
      glyph_y_center = uVar4;
      glyph_x_center = uVar1;
    }
    borg_needs_new_sea = false;
    uVar13 = 0;
    what = format("# Glyph Creating at (%d,%d)");
    borg_note(what);
    _Var6 = borg_spell_fail(GLYPH_OF_WARDING,L'\x1e');
    if (((_Var6) || (_Var6 = borg_read_scroll(sv_scroll_rune_of_protection), _Var6)) ||
       (_Var6 = borg_activate_item(act_glyph), _Var6)) {
      uVar7 = track_glyph.num;
      uVar15 = uVar7;
      if ((short)uVar7 < 1) {
        uVar15 = 0;
      }
      while( true ) {
        if (uVar15 == uVar13) {
          if (track_glyph.size <= (short)uVar7) {
            return true;
          }
          borg_note("# Noting the creation of a glyph.");
          iVar5 = track_glyph.num;
          lVar10 = (long)track_glyph.num;
          track_glyph.x[lVar10] = borg.c.x;
          track_glyph.y[lVar10] = borg.c.y;
          track_glyph.num = iVar5 + 1;
          return true;
        }
        if ((track_glyph.x[uVar13] == borg.c.x) && (track_glyph.y[uVar13] == borg.c.y)) break;
        uVar13 = uVar13 + 1;
      }
    }
  }
  else {
    local_114 = -1;
    borg_flow_reverse(L'ú',true,false,false,L'\xffffffff',false);
    uVar9 = (uint)glyph_x_center;
    wVar8 = (wchar_t)glyph_y_center;
    for (uVar17 = 0xf; wVar16 = (wchar_t)uVar13, uVar17 != 0x33; uVar17 = uVar17 + 1) {
      pbVar3 = borg_grids[uVar17];
      for (uVar18 = 0x32; uVar18 != 0x94; uVar18 = uVar18 + 1) {
        uVar1 = pbVar3[uVar18].feat;
        if (((uVar1 == '\x01') || (pbVar3[uVar18].glyph == false)) &&
           (bVar2 = borg_data_cost->data[uVar17][uVar18], bVar2 < 0x4b)) {
          lVar10 = 0;
          while( true ) {
            wVar16 = (wchar_t)uVar17;
            if (lVar10 == 0x18) break;
            ag_ptr[lVar10] =
                 borg_grids[borg_ddy_ddd[lVar10] + wVar16] +
                 ((int)borg_ddx_ddd[lVar10] + (int)uVar18);
            lVar10 = lVar10 + 1;
          }
          if ((borg_needs_new_sea & 1U) == 0) {
            for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 1) {
              if (((uVar18 == (int)borg_ddx_ddd[lVar10] + uVar9) &&
                  (uVar17 == (uint)(borg_ddy_ddd[lVar10] + wVar8))) &&
                 ((pbVar3[uVar18].glyph == false && (local_114 <= (int)(500 - (uint)bVar2))))) {
                uVar13 = uVar18 & 0xffffffff;
                y = wVar16;
                local_114 = 500 - (uint)bVar2;
              }
            }
          }
          else {
            iVar14 = 0;
            for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 1) {
              if ((ag_ptr[lVar10]->feat == '\x01') || (ag_ptr[lVar10]->glyph == true)) {
                iVar14 = iVar14 + 1;
              }
            }
            if (iVar14 == 0x18) {
              iVar14 = 0;
              for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 1) {
                iVar14 = iVar14 + (uint)ag_ptr[lVar10]->glyph;
              }
              iVar11 = iVar14 * 500 - (uint)bVar2;
              iVar12 = iVar11 + 0xc1c;
              if (uVar1 != '\x01') {
                iVar12 = iVar11 + 100;
              }
              if (iVar14 == 0x18) {
                iVar12 = iVar12 + 5000;
              }
              else if (pbVar3[uVar18].glyph != false) goto LAB_002064e4;
              if ((0 < iVar12) && (local_114 <= iVar12)) {
                uVar13 = uVar18 & 0xffffffff;
                y = wVar16;
                local_114 = iVar12;
              }
            }
          }
        }
LAB_002064e4:
      }
    }
    if (glyph_x_center != '\0' && wVar8 != L'\0') {
      iVar14 = 0;
      for (lVar10 = 0; wVar16 = (wchar_t)uVar13, lVar10 != 0x18; lVar10 = lVar10 + 1) {
        iVar14 = iVar14 + (uint)borg_grids[(long)borg_ddy_ddd[lVar10] + (ulong)(uint)wVar8]
                                [(ulong)uVar9 + (long)borg_ddx_ddd[lVar10]].glyph;
        if (iVar14 == 0x18) {
          local_114 = 5000;
          uVar13 = (ulong)uVar9;
          y = wVar8;
        }
      }
    }
    borg_flow_clear();
    if (-1 < local_114) {
      glyph_x = (uint8_t)wVar16;
      glyph_y = (uint8_t)y;
      borg_flow_enqueue_grid(y,wVar16);
      borg_flow_spread(L'ú',true,false,false,L'\xffffffff',false);
      _Var6 = borg_flow_commit("Glyph",L'\x03');
      if (!_Var6) {
        return false;
      }
      _Var6 = borg_flow_old(L'\x03');
      return _Var6;
    }
  }
  return false;
}

Assistant:

bool borg_flow_glyph(int why)
{
    int i;
    int cost;

    int x, y;
    int v          = 0;

    int b_x        = borg.c.x;
    int b_y        = borg.c.y;
    int b_v        = -1;
    int goal_glyph = 0;
    int glyph      = 0;

    borg_grid *ag;

    if ((glyph_y_center == 0 && glyph_x_center == 0)
        || distance(borg.c, loc(glyph_x_center, glyph_y_center)) >= 50) {
        borg_needs_new_sea = true;
    }

    /* We have arrived */
    if ((glyph_x == borg.c.x) && (glyph_y == borg.c.y)) {
        /* Cancel */
        glyph_x = 0;
        glyph_y = 0;

        /* Store the center of the glyphs */
        if (borg_needs_new_sea) {
            glyph_y_center = borg.c.y;
            glyph_x_center = borg.c.x;
        }

        borg_needs_new_sea = false;

        /* Take note */
        borg_note(format("# Glyph Creating at (%d,%d)", borg.c.x, borg.c.y));

        /* Create the Glyph */
        if (borg_spell_fail(GLYPH_OF_WARDING, 30)
            || borg_read_scroll(sv_scroll_rune_of_protection)
            || borg_activate_item(act_glyph)) {
            /* Check for an existing glyph */
            for (i = 0; i < track_glyph.num; i++) {
                /* Stop if we already new about this glyph */
                if ((track_glyph.x[i] == borg.c.x)
                    && (track_glyph.y[i] == borg.c.y))
                    return false;
            }

            /* Track the newly discovered glyph */
            if (track_glyph.num < track_glyph.size) {
                borg_note("# Noting the creation of a glyph.");
                track_glyph.x[track_glyph.num] = borg.c.x;
                track_glyph.y[track_glyph.num] = borg.c.y;
                track_glyph.num++;
            }

            /* Success */
            return true;
        }

        /* Nope */
        return false;
    }

    /* Reverse flow */
    borg_flow_reverse(250, true, false, false, -1, false);

    /* Scan the entire map */
    for (y = 15; y < AUTO_MAX_Y - 15; y++) {
        for (x = 50; x < AUTO_MAX_X - 50; x++) {
            borg_grid *ag_ptr[24];

            int floor     = 0;
            int tmp_glyph = 0;

            /* Acquire the grid */
            ag = &borg_grids[y][x];

            /* Skip every non floor/glyph */
            if (ag->feat != FEAT_FLOOR && ag->glyph)
                continue;

            /* Acquire the cost */
            cost = borg_data_cost->data[y][x];

            /* Skip grids that are really far away.  He probably
             * won't be able to safely get there
             */
            if (cost >= 75)
                continue;

            /* Extract adjacent locations to each considered grid */
            for (i = 0; i < 24; i++) {
                /* Extract the location */
                int xx = x + borg_ddx_ddd[i];
                int yy = y + borg_ddy_ddd[i];

                /* Get the grid contents */
                ag_ptr[i] = &borg_grids[yy][xx];
            }

            /* Center Grid */
            if (borg_needs_new_sea) {
                goal_glyph = 24;

                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];
                    if (ag->feat == FEAT_FLOOR || ag->glyph)
                        floor++;
                }

                /* Not a good location if not the center of the sea */
                if (floor != 24) {
                    continue;
                }

                /* Count floors already glyphed */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];

                    /* Glyphs */
                    if (ag->glyph) {
                        tmp_glyph++;
                    }
                }

                /* Tweak -- Reward certain floors, punish distance */
                v = 100 + (tmp_glyph * 500) - (cost * 1);
                if (borg_grids[y][x].feat == FEAT_FLOOR)
                    v += 3000;

                /* If this grid is surrounded by glyphs, select it */
                if (tmp_glyph == goal_glyph)
                    v += 5000;

                /* If this grid is already glyphed but not
                 * surrounded by glyphs, then choose another.
                 */
                if (tmp_glyph != goal_glyph && borg_grids[y][x].glyph)
                    v = -1;

                /* The grid is not searchable */
                if (v <= 0)
                    continue;

                /* Track "best" grid */
                if ((b_v >= 0) && (v < b_v))
                    continue;

                /* Save the data */
                b_v = v;
                b_x = x;
                b_y = y;
            }
            /* old center, making outlying glyphs, */
            else {
                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    /* Leave if this grid is not in good array */
                    if (glyph_x_center + borg_ddx_ddd[i] != x)
                        continue;
                    if (glyph_y_center + borg_ddy_ddd[i] != y)
                        continue;

                    /* Already got a glyph on it */
                    if (borg_grids[y][x].glyph)
                        continue;

                    /* Tweak -- Reward certain floors, punish distance */
                    v = 500 + (tmp_glyph * 500) - (cost * 1);

                    /* The grid is not searchable */
                    if (v <= 0)
                        continue;

                    /* Track "best" grid */
                    if ((b_v >= 0) && (v < b_v))
                        continue;

                    /* Save the data */
                    b_v = v;
                    b_x = x;
                    b_y = y;
                }
            }
        }
    }

    /* Extract adjacent locations to each considered grid */
    if (glyph_y_center != 0 && glyph_x_center != 0) {

        for (i = 0; i < 24; i++) {
            /* Extract the location */
            int xx = glyph_x_center + borg_ddx_ddd[i];
            int yy = glyph_y_center + borg_ddy_ddd[i];

            borg_grid *ag_ptr[24];

            /* Get the grid contents */
            ag_ptr[i] = &borg_grids[yy][xx];
            ag        = ag_ptr[i];

            /* If it is not a glyph, skip it */
            if (ag->glyph)
                glyph++;

            /* Save the data */
            if (glyph == 24) {
                b_v = 5000;
                b_x = glyph_x_center;
                b_y = glyph_y_center;
            }
        }
    }

    /* Clear the flow codes */
    borg_flow_clear();

    /* Hack -- Nothing found */
    if (b_v < 0)
        return false;

    /* Access grid */
    ag = &borg_grids[b_y][b_x];

    /* Memorize */
    glyph_x = b_x;
    glyph_y = b_y;

    /* Enqueue the grid */
    borg_flow_enqueue_grid(b_y, b_x);

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Glyph", GOAL_MISC))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_MISC))
        return false;

    /* Success */
    return true;
}